

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regexp_object.cpp
# Opt level: O3

void test_main(void)

{
  slot **ppsVar1;
  bool *pbVar2;
  undefined8 uVar3;
  version vVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  char **ppcVar8;
  ulong *puVar9;
  undefined8 uVar10;
  bool *pbVar11;
  char *pcVar12;
  string __str;
  string __str_5;
  gc_heap h;
  ulong *local_1d8;
  anon_union_32_5_7b1e0779_for_value_3 local_1d0;
  bool **local_1b0;
  long local_1a8;
  bool *local_1a0 [2];
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  wstring_view local_170;
  char *local_160;
  long lStack_158;
  string_view local_150;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  string_view local_110;
  char *local_100 [2];
  undefined1 local_f0 [16];
  slot *local_e0 [12];
  string_view local_80;
  string_view local_70;
  string local_60;
  string_view local_40;
  
  vVar4 = tested_version();
  if (vVar4 == es1) {
    local_f0._0_8_ = (gc_heap_ptr_untyped **)0xd;
    local_f0._8_8_ = L"new RegExp();";
    expect_eval_exception_abi_cxx11_(&local_60,(wstring_view *)local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return;
    }
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    return;
  }
  local_110._M_len = 0x235;
  local_110._M_str =
       "\nr=new RegExp();\n\nr.key=42;\nkeys = \'\';\nfor (var k in r) { keys += k+\',\'; }\nkeys; //$string \'key,\'\n\ndelete r.source;\nr.source; //$string \'(?:)\'\nr.source=42;\nr.source; //$string \'(?:)\'\n\ndelete r.global;\nr.global; //$boolean false\nr.global = 42;\nr.global; //$boolean false\n\ndelete r.ignoreCase;\nr.ignoreCase; //$boolean false\nr.ignoreCase = 42;\nr.ignoreCase; //$boolean false\n\ndelete r.multiline;\nr.multiline; //$boolean false\nr.multiline = false;\nr.multiline; //$boolean false\n\ndelete r.lastIndex;\nr.lastIndex; //$number 0\nr.lastIndex = 42;\nr.lastIndex; //$number 42\n"
  ;
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"testspec@","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_120 = *plVar7;
    lStack_118 = plVar5[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar7;
    local_130 = (long *)*plVar5;
  }
  local_128 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
    local_150._M_len = (size_t)&local_140;
  }
  else {
    local_140 = *plVar7;
    local_150._M_len = (size_t)*plVar5;
  }
  local_150._M_str = (char *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  ppcVar8 = (char **)(plVar5 + 2);
  if ((char **)*plVar5 == ppcVar8) {
    local_160 = *ppcVar8;
    lStack_158 = plVar5[3];
    local_170._M_len = (size_t)&local_160;
  }
  else {
    local_160 = *ppcVar8;
    local_170._M_len = (size_t)*plVar5;
  }
  local_170._M_str = (wchar_t *)plVar5[1];
  *plVar5 = (long)ppcVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
  uVar3 = (long)&local_1d0 + 8;
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_1d0._8_8_ = *puVar9;
    local_1d0.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)puVar6[3];
    local_1d8 = (ulong *)uVar3;
  }
  else {
    local_1d0._8_8_ = *puVar9;
    local_1d8 = (ulong *)*puVar6;
  }
  local_1d0.n_ = (double)puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct((ulong)&local_1b0,'\x02');
  *(undefined2 *)local_1b0 = 0x3834;
  pbVar2 = (bool *)((long)&((local_1d0.s_.super_gc_heap_ptr<mjs::gc_string>.
                             super_gc_heap_ptr_untyped.heap_)->pointers_).set_ + local_1a8);
  uVar10 = (bool *)0xf;
  if (local_1d8 != (ulong *)uVar3) {
    uVar10 = local_1d0._8_8_;
  }
  if ((ulong)uVar10 < pbVar2) {
    pbVar11 = (bool *)0xf;
    if (local_1b0 != local_1a0) {
      pbVar11 = local_1a0[0];
    }
    if (pbVar11 < pbVar2) goto LAB_00112ae6;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_1d8);
  }
  else {
LAB_00112ae6:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b0);
  }
  local_f0._0_8_ = local_e0;
  ppsVar1 = (slot **)(puVar6 + 2);
  if ((slot **)*puVar6 == ppsVar1) {
    local_e0[0] = *ppsVar1;
    local_e0[1] = (slot *)puVar6[3];
  }
  else {
    local_e0[0] = *ppsVar1;
    local_f0._0_8_ = (slot **)*puVar6;
  }
  local_f0._8_8_ = puVar6[1];
  *puVar6 = ppsVar1;
  puVar6[1] = 0;
  *(undefined1 *)ppsVar1 = 0;
  local_80._M_str = (char *)local_f0._0_8_;
  local_80._M_len = local_f0._8_8_;
  mjs::run_test_spec(&local_110,&local_80);
  if ((slot **)local_f0._0_8_ != local_e0) {
    operator_delete((void *)local_f0._0_8_,(long)local_e0[0] + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,(ulong)(local_1a0[0] + 1));
  }
  if (local_1d8 != (ulong *)uVar3) {
    operator_delete(local_1d8,(ulong)(local_1d0._8_8_ + 1));
  }
  if ((char **)local_170._M_len != &local_160) {
    operator_delete((void *)local_170._M_len,(ulong)(local_160 + 1));
  }
  if ((long *)local_150._M_len != &local_140) {
    operator_delete((void *)local_150._M_len,local_140 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  local_110._M_len = 0x10c;
  local_110._M_str =
       "\nRegExp.prototype.constructor.length;//$number 2\nr=RegExp.prototype.constructor(\'a*b\', \'gim\');\n\nr.source; //$string \'a*b\'\nr.global; //$boolean true\nr.ignoreCase; //$boolean true\nr.multiline; //$boolean true\nr.lastIndex; //$number 0\n\nr.toString(); //$string \'/a*b/gim\'\n"
  ;
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"testspec@","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_120 = *plVar7;
    lStack_118 = plVar5[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar7;
    local_130 = (long *)*plVar5;
  }
  local_128 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
    local_150._M_len = (size_t)&local_140;
  }
  else {
    local_140 = *plVar7;
    local_150._M_len = (size_t)*plVar5;
  }
  local_150._M_str = (char *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  ppcVar8 = (char **)(plVar5 + 2);
  if ((char **)*plVar5 == ppcVar8) {
    local_160 = *ppcVar8;
    lStack_158 = plVar5[3];
    local_170._M_len = (size_t)&local_160;
  }
  else {
    local_160 = *ppcVar8;
    local_170._M_len = (size_t)*plVar5;
  }
  local_170._M_str = (wchar_t *)plVar5[1];
  *plVar5 = (long)ppcVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_1d0._8_8_ = *puVar9;
    local_1d0.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)puVar6[3];
    local_1d8 = (ulong *)uVar3;
  }
  else {
    local_1d0._8_8_ = *puVar9;
    local_1d8 = (ulong *)*puVar6;
  }
  local_1d0.n_ = (double)puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct((ulong)&local_1b0,'\x02');
  *(undefined2 *)local_1b0 = 0x3136;
  pbVar2 = (bool *)((long)&((local_1d0.s_.super_gc_heap_ptr<mjs::gc_string>.
                             super_gc_heap_ptr_untyped.heap_)->pointers_).set_ + local_1a8);
  uVar10 = (bool *)0xf;
  if (local_1d8 != (ulong *)uVar3) {
    uVar10 = local_1d0._8_8_;
  }
  if ((ulong)uVar10 < pbVar2) {
    pbVar11 = (bool *)0xf;
    if (local_1b0 != local_1a0) {
      pbVar11 = local_1a0[0];
    }
    if (pbVar11 < pbVar2) goto LAB_00112e40;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_1d8);
  }
  else {
LAB_00112e40:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b0);
  }
  ppsVar1 = (slot **)(puVar6 + 2);
  if ((slot **)*puVar6 == ppsVar1) {
    local_e0[0] = *ppsVar1;
    local_e0[1] = (slot *)puVar6[3];
    local_f0._0_8_ = local_e0;
  }
  else {
    local_e0[0] = *ppsVar1;
    local_f0._0_8_ = (slot **)*puVar6;
  }
  local_f0._8_8_ = puVar6[1];
  *puVar6 = ppsVar1;
  puVar6[1] = 0;
  *(undefined1 *)ppsVar1 = 0;
  local_80._M_str = (char *)local_f0._0_8_;
  local_80._M_len = local_f0._8_8_;
  mjs::run_test_spec(&local_110,&local_80);
  if ((slot **)local_f0._0_8_ != local_e0) {
    operator_delete((void *)local_f0._0_8_,(long)local_e0[0] + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,(ulong)(local_1a0[0] + 1));
  }
  if (local_1d8 != (ulong *)uVar3) {
    operator_delete(local_1d8,(ulong)(local_1d0._8_8_ + 1));
  }
  if ((char **)local_170._M_len != &local_160) {
    operator_delete((void *)local_170._M_len,(ulong)(local_160 + 1));
  }
  if ((long *)local_150._M_len != &local_140) {
    operator_delete((void *)local_150._M_len,local_140 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  local_110._M_len = 0x146;
  local_110._M_str =
       "\nr = / test \\/ foo /gi;\n\nr instanceof RegExp; //$boolean true\nr.source; //$string \' test \\\\/ foo \'\nr.global; //$boolean true\nr.ignoreCase; //$boolean true\nr.multiline; //$boolean false\nr.lastIndex; //$number 0\n\nr.toString(); //$string \'/ test \\\\/ foo /gi\'\n\nx = /a/gi; x === x; //$boolean true\n/a/gi == /a/gi; //$boolean false\n"
  ;
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"testspec@","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_120 = *plVar7;
    lStack_118 = plVar5[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar7;
    local_130 = (long *)*plVar5;
  }
  local_128 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
    local_150._M_len = (size_t)&local_140;
  }
  else {
    local_140 = *plVar7;
    local_150._M_len = (size_t)*plVar5;
  }
  local_150._M_str = (char *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  ppcVar8 = (char **)(plVar5 + 2);
  if ((char **)*plVar5 == ppcVar8) {
    local_160 = *ppcVar8;
    lStack_158 = plVar5[3];
    local_170._M_len = (size_t)&local_160;
  }
  else {
    local_160 = *ppcVar8;
    local_170._M_len = (size_t)*plVar5;
  }
  local_170._M_str = (wchar_t *)plVar5[1];
  *plVar5 = (long)ppcVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_1d0._8_8_ = *puVar9;
    local_1d0.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)puVar6[3];
    local_1d8 = (ulong *)uVar3;
  }
  else {
    local_1d0._8_8_ = *puVar9;
    local_1d8 = (ulong *)*puVar6;
  }
  local_1d0.n_ = (double)puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct((ulong)&local_1b0,'\x02');
  *(undefined2 *)local_1b0 = 0x3238;
  pbVar2 = (bool *)((long)&((local_1d0.s_.super_gc_heap_ptr<mjs::gc_string>.
                             super_gc_heap_ptr_untyped.heap_)->pointers_).set_ + local_1a8);
  uVar10 = (bool *)0xf;
  if (local_1d8 != (ulong *)uVar3) {
    uVar10 = local_1d0._8_8_;
  }
  if ((ulong)uVar10 < pbVar2) {
    pbVar11 = (bool *)0xf;
    if (local_1b0 != local_1a0) {
      pbVar11 = local_1a0[0];
    }
    if (pbVar11 < pbVar2) goto LAB_00113193;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_1d8);
  }
  else {
LAB_00113193:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b0);
  }
  ppsVar1 = (slot **)(puVar6 + 2);
  if ((slot **)*puVar6 == ppsVar1) {
    local_e0[0] = *ppsVar1;
    local_e0[1] = (slot *)puVar6[3];
    local_f0._0_8_ = local_e0;
  }
  else {
    local_e0[0] = *ppsVar1;
    local_f0._0_8_ = (slot **)*puVar6;
  }
  local_f0._8_8_ = puVar6[1];
  *puVar6 = ppsVar1;
  puVar6[1] = 0;
  *(undefined1 *)ppsVar1 = 0;
  local_80._M_str = (char *)local_f0._0_8_;
  local_80._M_len = local_f0._8_8_;
  mjs::run_test_spec(&local_110,&local_80);
  if ((slot **)local_f0._0_8_ != local_e0) {
    operator_delete((void *)local_f0._0_8_,(long)local_e0[0] + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,(ulong)(local_1a0[0] + 1));
  }
  if (local_1d8 != (ulong *)uVar3) {
    operator_delete(local_1d8,(ulong)(local_1d0._8_8_ + 1));
  }
  if ((char **)local_170._M_len != &local_160) {
    operator_delete((void *)local_170._M_len,(ulong)(local_160 + 1));
  }
  if ((long *)local_150._M_len != &local_140) {
    operator_delete((void *)local_150._M_len,local_140 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  local_110._M_len = 0x4b5;
  local_110._M_str =
       "\nr = /(a*)b/;\n\nr.exec(\'xx\');       //$null\nr.test(\'xx\');       //$boolean false\n\n/undef/.test();     //$boolean true\n\nx = r.exec(\'aabb\');\nx instanceof Array; //$boolean true\nx.length;           //$number 2\nx[0];               //$string \'aab\'\nx[1];               //$string \'aa\'\nx.index;            //$number 0\nx.input;            //$string \'aabb\'\nr.lastIndex;        //$number 0\n\nx = r.exec(\'aabb\');\nx.length;           //$number 2\nx[0];               //$string \'aab\'\nx[1];               //$string \'aa\'\nx.index;            //$number 0\nx.input;            //$string \'aabb\'\nr.lastIndex;        //$number 0\n\nr.test(\'aaaaaabb\'); //$boolean true\n\ny = r.exec(\'x ab\');\ny.length;           //$number 2\ny[0];               //$string \'ab\'\ny[1];               //$string \'a\'\ny.index;            //$number 2\ny.input;            //$string \'x ab\'\n\nr = /\\w+/g;\ns = \'xx yy zz\';\nw = r.exec(s);\n\nw.length;           //$number 1\nw[0];               //$string \'xx\'\nr.lastIndex;        //$number 2\n\nw = r.exec(s);\nw.length;           //$number 1\nw[0];               //$string \'yy\'\nr.lastIndex;        //$number 5\n\nw = r.exec(s);\nw.length;           //$number 1\nw[0];               //$string \'zz\'\nr.lastIndex;        //$number 8\n"
  ;
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"testspec@","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_120 = *plVar7;
    lStack_118 = plVar5[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar7;
    local_130 = (long *)*plVar5;
  }
  local_128 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
    local_150._M_len = (size_t)&local_140;
  }
  else {
    local_140 = *plVar7;
    local_150._M_len = (size_t)*plVar5;
  }
  local_150._M_str = (char *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  ppcVar8 = (char **)(plVar5 + 2);
  if ((char **)*plVar5 == ppcVar8) {
    local_160 = *ppcVar8;
    lStack_158 = plVar5[3];
    local_170._M_len = (size_t)&local_160;
  }
  else {
    local_160 = *ppcVar8;
    local_170._M_len = (size_t)*plVar5;
  }
  local_170._M_str = (wchar_t *)plVar5[1];
  *plVar5 = (long)ppcVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_1d0._8_8_ = *puVar9;
    local_1d0.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)puVar6[3];
    local_1d8 = (ulong *)uVar3;
  }
  else {
    local_1d0._8_8_ = *puVar9;
    local_1d8 = (ulong *)*puVar6;
  }
  local_1d0.n_ = (double)puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct((ulong)&local_1b0,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1b0,3,0x8a);
  pbVar2 = (bool *)((long)&((local_1d0.s_.super_gc_heap_ptr<mjs::gc_string>.
                             super_gc_heap_ptr_untyped.heap_)->pointers_).set_ + local_1a8);
  uVar10 = (bool *)0xf;
  if (local_1d8 != (ulong *)uVar3) {
    uVar10 = local_1d0._8_8_;
  }
  if ((ulong)uVar10 < pbVar2) {
    pbVar11 = (bool *)0xf;
    if (local_1b0 != local_1a0) {
      pbVar11 = local_1a0[0];
    }
    if (pbVar11 < pbVar2) goto LAB_001134f0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_1d8);
  }
  else {
LAB_001134f0:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b0);
  }
  ppsVar1 = (slot **)(puVar6 + 2);
  if ((slot **)*puVar6 == ppsVar1) {
    local_e0[0] = *ppsVar1;
    local_e0[1] = (slot *)puVar6[3];
    local_f0._0_8_ = local_e0;
  }
  else {
    local_e0[0] = *ppsVar1;
    local_f0._0_8_ = (slot **)*puVar6;
  }
  local_f0._8_8_ = puVar6[1];
  *puVar6 = ppsVar1;
  puVar6[1] = 0;
  *(undefined1 *)ppsVar1 = 0;
  local_80._M_str = (char *)local_f0._0_8_;
  local_80._M_len = local_f0._8_8_;
  mjs::run_test_spec(&local_110,&local_80);
  if ((slot **)local_f0._0_8_ != local_e0) {
    operator_delete((void *)local_f0._0_8_,(long)local_e0[0] + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,(ulong)(local_1a0[0] + 1));
  }
  if (local_1d8 != (ulong *)uVar3) {
    operator_delete(local_1d8,(ulong)(local_1d0._8_8_ + 1));
  }
  if ((char **)local_170._M_len != &local_160) {
    operator_delete((void *)local_170._M_len,(ulong)(local_160 + 1));
  }
  if ((long *)local_150._M_len != &local_140) {
    operator_delete((void *)local_150._M_len,local_140 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  local_110._M_len = 0x43f;
  local_110._M_str =
       "\n// ES3, 15.10.3.1\nr =  /xyz/g;\nRegExp(r) === r; //$boolean true\nRegExp(r,undefined) === r; //$boolean true\nnew RegExp(r) === r; //$boolean false\n\n// ES3, 15.10.4.1\nre = new RegExp(/ab/gi, undefined);\nre.source;//$string \'ab\'\nre.global;//$boolean true\nre.ignoreCase;//$boolean true\ntry { RegExp(/ab/,\'gi\'); } catch (e) { e.toString(); } //$string \'TypeError: Invalid flags argument to RegExp constructor\'\ntry { new RegExp(/ab/,\'gi\'); } catch (e) { e.toString(); } //$string \'TypeError: Invalid flags argument to RegExp constructor\'\ntry { new RegExp(\'123\',\'x\'); } catch (e) { e.toString(); } //$string \'SyntaxError: Invalid flag \\\'x\\\' given to RegExp constructor\'\ntry { new RegExp(\'123\',\'gig\'); } catch (e) { e.toString(); } //$string \'SyntaxError: Duplicate flag \\\'g\\\' given to RegExp constructor\'\n// ES3, 15.10.6\nfunction e(func) { try { RegExp.prototype[func].call({}); } catch (e) { return e.toString(); } };\ne(\'toString\'); //$string \'TypeError: Object is not a RegExp\'\ne(\'exec\'); //$string \'TypeError: Object is not a RegExp\'\ne(\'test\'); //$string \'TypeError: Object is not a RegExp\'\n"
  ;
  local_190 = &local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"testspec@","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_120 = *plVar7;
    lStack_118 = plVar5[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar7;
    local_130 = (long *)*plVar5;
  }
  local_128 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
    local_150._M_len = (size_t)&local_140;
  }
  else {
    local_140 = *plVar7;
    local_150._M_len = (size_t)*plVar5;
  }
  local_150._M_str = (char *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  ppcVar8 = (char **)(plVar5 + 2);
  if ((char **)*plVar5 == ppcVar8) {
    local_160 = *ppcVar8;
    lStack_158 = plVar5[3];
    local_170._M_len = (size_t)&local_160;
  }
  else {
    local_160 = *ppcVar8;
    local_170._M_len = (size_t)*plVar5;
  }
  local_170._M_str = (wchar_t *)plVar5[1];
  *plVar5 = (long)ppcVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_1d0._8_8_ = *puVar9;
    local_1d0.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)puVar6[3];
    local_1d8 = (ulong *)uVar3;
  }
  else {
    local_1d0._8_8_ = *puVar9;
    local_1d8 = (ulong *)*puVar6;
  }
  local_1d0.n_ = (double)puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct((ulong)&local_1b0,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1b0,3,0xb1);
  pbVar2 = (bool *)((long)&((local_1d0.s_.super_gc_heap_ptr<mjs::gc_string>.
                             super_gc_heap_ptr_untyped.heap_)->pointers_).set_ + local_1a8);
  uVar10 = (bool *)0xf;
  if (local_1d8 != (ulong *)uVar3) {
    uVar10 = local_1d0._8_8_;
  }
  if ((ulong)uVar10 < pbVar2) {
    pbVar11 = (bool *)0xf;
    if (local_1b0 != local_1a0) {
      pbVar11 = local_1a0[0];
    }
    if (pbVar11 < pbVar2) goto LAB_0011384d;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_1d8);
  }
  else {
LAB_0011384d:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b0);
  }
  ppsVar1 = (slot **)(puVar6 + 2);
  if ((slot **)*puVar6 == ppsVar1) {
    local_e0[0] = *ppsVar1;
    local_e0[1] = (slot *)puVar6[3];
    local_f0._0_8_ = local_e0;
  }
  else {
    local_e0[0] = *ppsVar1;
    local_f0._0_8_ = (slot **)*puVar6;
  }
  local_f0._8_8_ = puVar6[1];
  *puVar6 = ppsVar1;
  puVar6[1] = 0;
  *(undefined1 *)ppsVar1 = 0;
  local_80._M_str = (char *)local_f0._0_8_;
  local_80._M_len = local_f0._8_8_;
  mjs::run_test_spec(&local_110,&local_80);
  if ((slot **)local_f0._0_8_ != local_e0) {
    operator_delete((void *)local_f0._0_8_,(long)local_e0[0] + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,(ulong)(local_1a0[0] + 1));
  }
  if (local_1d8 != (ulong *)uVar3) {
    operator_delete(local_1d8,(ulong)(local_1d0._8_8_ + 1));
  }
  if ((char **)local_170._M_len != &local_160) {
    operator_delete((void *)local_170._M_len,(ulong)(local_160 + 1));
  }
  if ((long *)local_150._M_len != &local_140) {
    operator_delete((void *)local_150._M_len,local_140 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  mjs::gc_heap::gc_heap((gc_heap *)local_f0,0x2000);
  run_test_debug_pos("test_main",
                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                     ,0xb5);
  local_170._M_len = 0x17;
  local_170._M_str = L"RegExp.prototype.source";
  vVar4 = tested_version();
  if ((int)vVar4 < 2) {
    mjs::value::value((value *)&local_1d8,(value *)&mjs::value::undefined);
  }
  else {
    local_150._M_len = 4;
    local_150._M_str = "(?:)";
    mjs::string::string((string *)&local_80,(gc_heap *)local_f0,&local_150);
    local_1d8 = (ulong *)CONCAT44(local_1d8._4_4_,4);
    local_1d0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_80._M_len;
    local_1d0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
         local_80._M_str._0_4_;
    if ((gc_heap *)local_80._M_len != (gc_heap *)0x0) {
      mjs::gc_heap::attach((gc_heap *)local_80._M_len,(gc_heap_ptr_untyped *)&local_1d0.s_);
    }
  }
  run_test(&local_170,(value *)&local_1d8);
  mjs::value::destroy((value *)&local_1d8);
  if (1 < (int)vVar4) {
    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_80);
  }
  vVar4 = tested_version();
  if ((int)vVar4 < 2) goto LAB_00113e04;
  local_70._M_len = 0x80;
  local_70._M_str =
       "\nr = /[/]/;\nr.source; //$string \'[\\\\/]\'\nr.global; //$boolean false\nr.ignoreCase; //$boolean false\nr.multiline; //$boolean false\n"
  ;
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"testspec@","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  local_190 = &local_180;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_180 = *plVar7;
    lStack_178 = plVar5[3];
  }
  else {
    local_180 = *plVar7;
    local_190 = (long *)*plVar5;
  }
  local_188 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_120 = *plVar7;
    lStack_118 = plVar5[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar7;
    local_130 = (long *)*plVar5;
  }
  local_128 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
    local_150._M_len = (size_t)&local_140;
  }
  else {
    local_140 = *plVar7;
    local_150._M_len = (size_t)*plVar5;
  }
  local_150._M_str = (char *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  ppcVar8 = (char **)(plVar5 + 2);
  if ((char **)*plVar5 == ppcVar8) {
    local_160 = *ppcVar8;
    lStack_158 = plVar5[3];
    local_170._M_len = (size_t)&local_160;
  }
  else {
    local_160 = *ppcVar8;
    local_170._M_len = (size_t)*plVar5;
  }
  local_170._M_str = (wchar_t *)plVar5[1];
  *plVar5 = (long)ppcVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_110._M_len = (size_t)local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_110._M_len,3,0xbe);
  pcVar12 = (char *)0xf;
  if ((char **)local_170._M_len != &local_160) {
    pcVar12 = local_160;
  }
  if (pcVar12 < local_110._M_str + (long)local_170._M_str) {
    pcVar12 = (char *)0xf;
    if ((char **)local_110._M_len != local_100) {
      pcVar12 = local_100[0];
    }
    if (pcVar12 < local_110._M_str + (long)local_170._M_str) goto LAB_00113cc2;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,local_170._M_len);
  }
  else {
LAB_00113cc2:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_170,local_110._M_len);
  }
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_1d0._8_8_ = *puVar9;
    local_1d0.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)puVar6[3];
    local_1d8 = (ulong *)uVar3;
  }
  else {
    local_1d0._8_8_ = *puVar9;
    local_1d8 = (ulong *)*puVar6;
  }
  local_1d0.n_ = (double)puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  local_40._M_str = (char *)local_1d8;
  local_40._M_len = (size_t)local_1d0.n_;
  mjs::run_test_spec(&local_70,&local_40);
  if (local_1d8 != (ulong *)uVar3) {
    operator_delete(local_1d8,(ulong)(local_1d0._8_8_ + 1));
  }
  if ((char **)local_110._M_len != local_100) {
    operator_delete((void *)local_110._M_len,(ulong)(local_100[0] + 1));
  }
  if ((char **)local_170._M_len != &local_160) {
    operator_delete((void *)local_170._M_len,(ulong)(local_160 + 1));
  }
  if ((long *)local_150._M_len != &local_140) {
    operator_delete((void *)local_150._M_len,local_140 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,(ulong)(local_1a0[0] + 1));
  }
LAB_00113e04:
  mjs::gc_heap::~gc_heap((gc_heap *)local_f0);
  return;
}

Assistant:

void test_main() {
    if (tested_version() == version::es1) {
        expect_eval_exception(L"new RegExp();");
        // That RegExp literals aren't supported is tested elsewhere
        return;
    }

    // TODO: There will be looooooots of cases missing here...

    RUN_TEST_SPEC(R"(
r=new RegExp();

r.key=42;
keys = '';
for (var k in r) { keys += k+','; }
keys; //$string 'key,'

delete r.source;
r.source; //$string '(?:)'
r.source=42;
r.source; //$string '(?:)'

delete r.global;
r.global; //$boolean false
r.global = 42;
r.global; //$boolean false

delete r.ignoreCase;
r.ignoreCase; //$boolean false
r.ignoreCase = 42;
r.ignoreCase; //$boolean false

delete r.multiline;
r.multiline; //$boolean false
r.multiline = false;
r.multiline; //$boolean false

delete r.lastIndex;
r.lastIndex; //$number 0
r.lastIndex = 42;
r.lastIndex; //$number 42
)");

    RUN_TEST_SPEC(R"(
RegExp.prototype.constructor.length;//$number 2
r=RegExp.prototype.constructor('a*b', 'gim');

r.source; //$string 'a*b'
r.global; //$boolean true
r.ignoreCase; //$boolean true
r.multiline; //$boolean true
r.lastIndex; //$number 0

r.toString(); //$string '/a*b/gim'
)");


    //
    // RegExp literal
    //

    RUN_TEST_SPEC(R"(
r = / test \/ foo /gi;

r instanceof RegExp; //$boolean true
r.source; //$string ' test \\/ foo '
r.global; //$boolean true
r.ignoreCase; //$boolean true
r.multiline; //$boolean false
r.lastIndex; //$number 0

r.toString(); //$string '/ test \\/ foo /gi'

x = /a/gi; x === x; //$boolean true
/a/gi == /a/gi; //$boolean false
)");

    //
    // Check basic matching
    //
    RUN_TEST_SPEC(R"(
r = /(a*)b/;

r.exec('xx');       //$null
r.test('xx');       //$boolean false

/undef/.test();     //$boolean true

x = r.exec('aabb');
x instanceof Array; //$boolean true
x.length;           //$number 2
x[0];               //$string 'aab'
x[1];               //$string 'aa'
x.index;            //$number 0
x.input;            //$string 'aabb'
r.lastIndex;        //$number 0

x = r.exec('aabb');
x.length;           //$number 2
x[0];               //$string 'aab'
x[1];               //$string 'aa'
x.index;            //$number 0
x.input;            //$string 'aabb'
r.lastIndex;        //$number 0

r.test('aaaaaabb'); //$boolean true

y = r.exec('x ab');
y.length;           //$number 2
y[0];               //$string 'ab'
y[1];               //$string 'a'
y.index;            //$number 2
y.input;            //$string 'x ab'

r = /\w+/g;
s = 'xx yy zz';
w = r.exec(s);

w.length;           //$number 1
w[0];               //$string 'xx'
r.lastIndex;        //$number 2

w = r.exec(s);
w.length;           //$number 1
w[0];               //$string 'yy'
r.lastIndex;        //$number 5

w = r.exec(s);
w.length;           //$number 1
w[0];               //$string 'zz'
r.lastIndex;        //$number 8
)");

    //TODO:
    // - Invalid flags (no duplicates, case sensitive, invalid characters not allowed) => SyntaxError
    // - Invalid pattern => SyntaxError
    // - Matching (basic)
    //    - RegExp.prototype.exec(string)
    //    - RegExp.prototype.test(string) `RegExp.prototype.exec(string) != null`
    // - Multiline regex
    // - RegExp use with String
    // - Constructor corner cases
    // - etc...
    //
    // SyntaxError
    //
    // ES3, 15.10.2.5, 15.10.2.9, 15.10.2.15, 15.10.2.19
    //

    RUN_TEST_SPEC(R"(
// ES3, 15.10.3.1
r =  /xyz/g;
RegExp(r) === r; //$boolean true
RegExp(r,undefined) === r; //$boolean true
new RegExp(r) === r; //$boolean false

// ES3, 15.10.4.1
re = new RegExp(/ab/gi, undefined);
re.source;//$string 'ab'
re.global;//$boolean true
re.ignoreCase;//$boolean true
try { RegExp(/ab/,'gi'); } catch (e) { e.toString(); } //$string 'TypeError: Invalid flags argument to RegExp constructor'
try { new RegExp(/ab/,'gi'); } catch (e) { e.toString(); } //$string 'TypeError: Invalid flags argument to RegExp constructor'
try { new RegExp('123','x'); } catch (e) { e.toString(); } //$string 'SyntaxError: Invalid flag \'x\' given to RegExp constructor'
try { new RegExp('123','gig'); } catch (e) { e.toString(); } //$string 'SyntaxError: Duplicate flag \'g\' given to RegExp constructor'
// ES3, 15.10.6
function e(func) { try { RegExp.prototype[func].call({}); } catch (e) { return e.toString(); } };
e('toString'); //$string 'TypeError: Object is not a RegExp'
e('exec'); //$string 'TypeError: Object is not a RegExp'
e('test'); //$string 'TypeError: Object is not a RegExp'
)");

    // From ES5 RegExp.prototype is a RegExp object
    gc_heap h{8192};
    RUN_TEST(L"RegExp.prototype.source", tested_version() >= version::es5 ? value{string{h,"(?:)"}} : value::undefined);

    if (tested_version() >= version::es5) {
        RUN_TEST_SPEC(R"(
r = /[/]/;
r.source; //$string '[\\/]'
r.global; //$boolean false
r.ignoreCase; //$boolean false
r.multiline; //$boolean false
)");
    }
}